

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O3

void nni_http_res_init(nni_http_res *res)

{
  nni_list_init_offset(&(res->data).hdrs,0x10);
  (res->data).own = false;
  (res->data).data = (char *)0x0;
  (res->data).size = 0;
  (res->data).buf = (char *)0x0;
  (res->data).bufsz = 0;
  return;
}

Assistant:

void
nni_http_res_init(nni_http_res *res)
{
	NNI_LIST_INIT(&res->data.hdrs, http_header, node);
	res->data.buf   = NULL;
	res->data.bufsz = 0;
	res->data.data  = NULL;
	res->data.size  = 0;
	res->data.own   = false;
}